

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool ImGui_SetStyle(void)

{
  long lVar1;
  
  lVar1 = ImGui::GetStyle();
  *(undefined1 *)(lVar1 + 0xb2) = 1;
  *(undefined1 *)(lVar1 + 0xb0) = 1;
  *(undefined8 *)(lVar1 + 4) = 0x4100000041000000;
  *(undefined4 *)(lVar1 + 0xc) = 0;
  *(undefined8 *)(lVar1 + 0x38) = 0x4040000040800000;
  *(undefined4 *)(lVar1 + 0x40) = 0;
  *(undefined8 *)(lVar1 + 0x48) = 0x4080000041000000;
  *(undefined8 *)(lVar1 + 0x50) = 0x4080000040800000;
  *(undefined4 *)(lVar1 + 0x60) = 0x41a80000;
  *(undefined8 *)(lVar1 + 0x68) = 0x4110000041800000;
  *(undefined8 *)(lVar1 + 0x70) = 0x4040000041200000;
  *(undefined8 *)(lVar1 + 0xbc) = 0x3f8000003f800000;
  *(undefined8 *)(lVar1 + 0xc4) = 0x3f8000003f800000;
  *(undefined8 *)(lVar1 + 0xcc) = 0x3ed1eb853e75c28f;
  *(undefined8 *)(lVar1 + 0xd4) = 0x3f8000003ed1eb85;
  *(undefined8 *)(lVar1 + 0xdc) = 0x3da3d70a3da3d70a;
  *(undefined8 *)(lVar1 + 0xe4) = 0x3f70a3d73da3d70a;
  *(undefined8 *)(lVar1 + 0xfc) = 0x3d8f5c293d8f5c29;
  *(undefined8 *)(lVar1 + 0x104) = 0x3f8000003db851ec;
  *(undefined8 *)(lVar1 + 0x10c) = 0x3e9eb8523e9eb852;
  *(undefined8 *)(lVar1 + 0x114) = 0x3f35c28f3e9eb852;
  *(undefined8 *)(lVar1 + 0x11c) = 0;
  *(undefined8 *)(lVar1 + 0x124) = 0;
  *(undefined4 *)(lVar1 + 300) = 0;
  *(undefined8 *)(lVar1 + 0x130) = 0x3ec7ae143ec7ae14;
  *(undefined8 *)(lVar1 + 0x138) = 0x3e851eb83ec7ae14;
  *(undefined8 *)(lVar1 + 0x140) = 0x3f8000003f800000;
  *(undefined8 *)(lVar1 + 0x148) = 0x3ec7ae14;
  *(undefined8 *)(lVar1 + 0x150) = 0x3f47ae14;
  *(undefined8 *)(lVar1 + 0x158) = 0x3f800000;
  *(undefined8 *)(lVar1 + 0x160) = 0x3f0000003f000000;
  *(undefined8 *)(lVar1 + 0x168) = 0x3f333333;
  builtin_strncpy((char *)(lVar1 + 0x170),"333?333?",8);
  *(undefined8 *)(lVar1 + 0x178) = 0x3f800000;
  *(undefined8 *)(lVar1 + 0x180) = 0x3f0000003f000000;
  *(undefined8 *)(lVar1 + 0x188) = 0x3f800000;
  builtin_strncpy((char *)(lVar1 + 400),"333?333?",8);
  *(undefined8 *)(lVar1 + 0x198) = 0x3dcccccd3f800000;
  *(undefined8 *)(lVar1 + 0x1a0) = 0x3e8a3d713e8a3d71;
  *(undefined8 *)(lVar1 + 0x1a8) = 0x3f4ccccd3f800000;
  *(undefined8 *)(lVar1 + 0x1b0) = 0x3f547ae13f4ccccd;
  *(undefined8 *)(lVar1 + 0x1b8) = 0x3e851eb83e9eb852;
  *(undefined8 *)(lVar1 + 0x1c0) = 0x3f8000003f800000;
  *(undefined8 *)(lVar1 + 0x1c8) = 0x3ec7ae14;
  *(undefined8 *)(lVar1 + 0x1d0) = 0x3f47ae14;
  *(undefined8 *)(lVar1 + 0x1d8) = 0x3f4ccccd3f800000;
  *(undefined8 *)(lVar1 + 0x1e0) = 0x3f547ae13f4ccccd;
  *(undefined8 *)(lVar1 + 0x1e8) = 0x3f4ccccd3ec7ae14;
  *(undefined8 *)(lVar1 + 0x1f0) = 0x3f547ae13f4ccccd;
  *(undefined8 *)(lVar1 + 0x1f8) = 0x3ec7ae14;
  *(undefined8 *)(lVar1 + 0x200) = 0x3f47ae14;
  *(undefined8 *)(lVar1 + 0x208) = 0x3e051eb83f800000;
  *(undefined8 *)(lVar1 + 0x210) = 0x3f0ccccd3f0ccccd;
  *(undefined8 *)(lVar1 + 0x218) = 0x3f1c28f63f800000;
  *(undefined8 *)(lVar1 + 0x220) = 0x3f800000;
  *(undefined8 *)(lVar1 + 0x228) = 0x3f028f5c;
  *(undefined8 *)(lVar1 + 0x230) = 0x3f47ae14;
  *(undefined8 *)(lVar1 + 0x238) = 0x3f4a3d713f800000;
  *(undefined8 *)(lVar1 + 0x240) = 0x3f028f5c;
  *(undefined8 *)(lVar1 + 0x248) = 0x3f4a3d713f028f5c;
  *(undefined8 *)(lVar1 + 0x250) = 0x3f028f5c;
  *(undefined8 *)(lVar1 + 600) = 0x3f4a3d713f2b851f;
  *(undefined8 *)(lVar1 + 0x260) = 0x3f028f5c;
  *(undefined4 *)(lVar1 + 0x268) = 0x3f2b851f;
  *(undefined8 *)(lVar1 + 0x29c) = 0;
  *(undefined8 *)(lVar1 + 0x2a4) = 0;
  *(undefined8 *)(lVar1 + 0x2ac) = 0x3f8000003e851eb8;
  *(undefined8 *)(lVar1 + 0x2b4) = 0x3ec7ae143f800000;
  *(undefined8 *)(lVar1 + 700) = 0x3f47ae1400000000;
  *(undefined8 *)(lVar1 + 0x2c4) = 0x3f80000000000000;
  *(undefined8 *)(lVar1 + 0x31c) = 0x3f2666663f800000;
  *(undefined8 *)(lVar1 + 0x324) = 0x3f2b851f3ec28f5c;
  *(undefined8 *)(lVar1 + 0x32c) = 0x3f8000003e800000;
  *(undefined8 *)(lVar1 + 0x334) = 0x3f80000000000000;
  *(undefined8 *)(lVar1 + 0x33c) = 0x3f2666663f800000;
  *(undefined8 *)(lVar1 + 0x344) = 0x3f2b851f3ec28f5c;
  *(undefined8 *)(lVar1 + 0x34c) = 0x3f8000003e800000;
  *(undefined8 *)(lVar1 + 0x354) = 0x3f80000000000000;
  *(undefined8 *)(lVar1 + 0x35c) = 0x3f8000003e800000;
  *(undefined8 *)(lVar1 + 0x364) = 0x3edc28f600000000;
  *(undefined8 *)(lVar1 + 0x3ac) = 0x3f7ae1483f800000;
  *(undefined8 *)(lVar1 + 0x3b4) = 0x3f47ae143f733333;
  return true;
}

Assistant:

bool ImGui_SetStyle() {
    ImGuiStyle & style = ImGui::GetStyle();

    style.AntiAliasedFill = true;
    style.AntiAliasedLines = true;
    style.WindowRounding = 0.0f;

    style.WindowPadding = ImVec2(8, 8);
    style.WindowRounding = 0.0f;
    style.FramePadding = ImVec2(4, 3);
    style.FrameRounding = 0.0f;
    style.ItemSpacing = ImVec2(8, 4);
    style.ItemInnerSpacing = ImVec2(4, 4);
    style.IndentSpacing = 21.0f;
    style.ScrollbarSize = 16.0f;
    style.ScrollbarRounding = 9.0f;
    style.GrabMinSize = 10.0f;
    style.GrabRounding = 3.0f;

    style.Colors[ImGuiCol_Text]                  = ImVec4(1.00f, 1.00f, 1.00f, 1.00f);
    style.Colors[ImGuiCol_TextDisabled]          = ImVec4(0.24f, 0.41f, 0.41f, 1.00f);
    style.Colors[ImGuiCol_WindowBg]              = ImVec4(0.08f, 0.08f, 0.08f, 0.94f);
    //style.Colors[ImGuiCol_ChildWindowBg]         = ImVec4(0.07f, 0.07f, 0.09f, 1.00f);
    style.Colors[ImGuiCol_PopupBg]               = ImVec4(0.07f, 0.07f, 0.09f, 1.00f);
    style.Colors[ImGuiCol_Border]                = ImVec4(0.31f, 0.31f, 0.31f, 0.71f);
    style.Colors[ImGuiCol_BorderShadow]          = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    style.Colors[ImGuiCol_FrameBg]               = ImVec4(0.00f, 0.39f, 0.39f, 0.39f);
    style.Colors[ImGuiCol_FrameBgHovered]        = ImVec4(0.26f, 1.00f, 1.00f, 0.39f);
    style.Colors[ImGuiCol_FrameBgActive]         = ImVec4(0.00f, 0.78f, 0.00f, 1.00f);
    style.Colors[ImGuiCol_TitleBg]               = ImVec4(0.00f, 0.50f, 0.50f, 0.70f);
    style.Colors[ImGuiCol_TitleBgCollapsed]      = ImVec4(0.00f, 0.50f, 0.50f, 1.00f);
    style.Colors[ImGuiCol_TitleBgActive]         = ImVec4(0.00f, 0.70f, 0.70f, 1.00f);
    style.Colors[ImGuiCol_MenuBarBg]             = ImVec4(0.00f, 0.70f, 0.70f, 1.00f);
    style.Colors[ImGuiCol_ScrollbarBg]           = ImVec4(0.10f, 0.27f, 0.27f, 1.00f);
    style.Colors[ImGuiCol_ScrollbarGrab]         = ImVec4(0.80f, 0.80f, 0.83f, 0.31f);
    style.Colors[ImGuiCol_ScrollbarGrabHovered]  = ImVec4(0.26f, 1.00f, 1.00f, 0.39f);
    style.Colors[ImGuiCol_ScrollbarGrabActive]   = ImVec4(0.00f, 0.78f, 0.00f, 1.00f);
    //style.Colors[ImGuiCol_ComboBg]               = ImVec4(0.00f, 0.39f, 0.39f, 1.00f);
    style.Colors[ImGuiCol_CheckMark]             = ImVec4(0.80f, 0.80f, 0.83f, 0.39f);
    style.Colors[ImGuiCol_SliderGrab]            = ImVec4(0.80f, 0.80f, 0.83f, 0.39f);
    style.Colors[ImGuiCol_SliderGrabActive]      = ImVec4(0.00f, 0.78f, 0.00f, 1.00f);
    style.Colors[ImGuiCol_Button]                = ImVec4(0.13f, 0.55f, 0.55f, 1.00f);
    style.Colors[ImGuiCol_ButtonHovered]         = ImVec4(0.61f, 1.00f, 0.00f, 0.51f);
    style.Colors[ImGuiCol_ButtonActive]          = ImVec4(0.00f, 0.78f, 0.00f, 1.00f);
    style.Colors[ImGuiCol_Header]                = ImVec4(0.79f, 0.51f, 0.00f, 0.51f);
    style.Colors[ImGuiCol_HeaderHovered]         = ImVec4(0.79f, 0.51f, 0.00f, 0.67f);
    style.Colors[ImGuiCol_HeaderActive]          = ImVec4(0.79f, 0.51f, 0.00f, 0.67f);
    //style.Colors[ImGuiCol_Column]                = ImVec4(0.79f, 0.51f, 0.00f, 0.67f);
    //style.Colors[ImGuiCol_ColumnHovered]         = ImVec4(0.25f, 1.00f, 0.00f, 1.00f);
    //style.Colors[ImGuiCol_ColumnActive]          = ImVec4(0.79f, 0.51f, 0.00f, 0.67f);
    style.Colors[ImGuiCol_ResizeGrip]            = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    style.Colors[ImGuiCol_ResizeGripHovered]     = ImVec4(0.26f, 1.00f, 1.00f, 0.39f);
    style.Colors[ImGuiCol_ResizeGripActive]      = ImVec4(0.00f, 0.78f, 0.00f, 1.00f);
    //style.Colors[ImGuiCol_CloseButton]           = ImVec4(0.40f, 0.39f, 0.38f, 0.16f);
    //style.Colors[ImGuiCol_CloseButtonHovered]    = ImVec4(0.26f, 1.00f, 1.00f, 0.39f);
    //style.Colors[ImGuiCol_CloseButtonActive]     = ImVec4(0.79f, 0.51f, 0.00f, 0.67f);
    style.Colors[ImGuiCol_PlotLines]             = ImVec4(1.00f, 0.65f, 0.38f, 0.67f);
    style.Colors[ImGuiCol_PlotLinesHovered]      = ImVec4(0.25f, 1.00f, 0.00f, 1.00f);
    style.Colors[ImGuiCol_PlotHistogram]         = ImVec4(1.00f, 0.65f, 0.38f, 0.67f);
    style.Colors[ImGuiCol_PlotHistogramHovered]  = ImVec4(0.25f, 1.00f, 0.00f, 1.00f);
    style.Colors[ImGuiCol_TextSelectedBg]        = ImVec4(0.25f, 1.00f, 0.00f, 0.43f);
    style.Colors[ImGuiCol_ModalWindowDarkening]  = ImVec4(1.00f, 0.98f, 0.95f, 0.78f);

    return true;
}